

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::XFBCaptureStructTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBCaptureStructTest *this,GLuint test_case_index,
          STAGES stage)

{
  TestError *this_00;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (test_case_index == 2) {
    BufferTestBase::getShaderSource_abi_cxx11_(&sStack_38,&this->super_BufferTestBase,2,stage);
  }
  else if (test_case_index == 1) {
    if (FRAGMENT < stage) {
      return __return_storage_ptr__;
    }
    if ((0x2eU >> (stage & 0x1f) & 1) == 0) {
      return __return_storage_ptr__;
    }
    BufferTestBase::getShaderSource_abi_cxx11_(&sStack_38,&this->super_BufferTestBase,1,stage);
  }
  else {
    if (test_case_index != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x6a23);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if ((stage | GEOMETRY) != FRAGMENT) {
      return __return_storage_ptr__;
    }
    BufferTestBase::getShaderSource_abi_cxx11_(&sStack_38,&this->super_BufferTestBase,0,stage);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBCaptureStructTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	std::string source;

	switch (test_case_index)
	{
	case TEST_VS:
		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
		case Utils::Shader::VERTEX:
			source = BufferTestBase::getShaderSource(test_case_index, stage);
			break;
		default:
			break;
		}
		break;

	case TEST_TES:
		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
		case Utils::Shader::TESS_CTRL:
		case Utils::Shader::TESS_EVAL:
		case Utils::Shader::VERTEX:
			source = BufferTestBase::getShaderSource(test_case_index, stage);
			break;
		default:
			break;
		}
		break;

	case TEST_GS:
		source = BufferTestBase::getShaderSource(test_case_index, stage);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* */
	return source;
}